

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrtf.h
# Opt level: O1

float sqrtf_9(float x)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)((uint)x & 0x7fffff) * 1.1920929e-07;
  uVar1 = ((uint)x >> 0x17) - 0x7f;
  fVar3 = fVar2 * fVar2 * fVar2;
  fVar2 = fVar3 * fVar2 * -0.010765647 +
          fVar3 * 0.04585425 + fVar2 * fVar2 * -0.12047308 + fVar2 * 0.49959806 + 1.0;
  if ((uVar1 & 1) != 0) {
    fVar2 = fVar2 * 1.4142135;
  }
  return (float)((uVar1 & 0xfffffffe) * 0x400000 + 0x3f800000) * fVar2;
}

Assistant:

float sqrtf_9(const float x)
{
    union
    {
        float f;
        long i;
    } u;
    u.f = x;
    uint32_t intPart = ((u.i) >> 23); // get biased exponent
    intPart -= 127; // unbias it
    float n = (float)(u.i & 0x007FFFFF); // mask off exponent leaving 0x800000*(mantissa - 1)
    n *= 1.192092895507812e-07; // divide by 0x800000
    float accumulator = 1.0 + 0.49959804148061 * n;
    float xPower = n * n;
    accumulator += -0.12047308243453 * xPower;
    xPower *= n;
    accumulator += 0.04585425015501 * xPower;
    xPower *= n;
    accumulator += -0.01076564682800 * xPower;
    if (intPart & 0x00000001)
    {
        accumulator *= 1.41421356237309504880; // an odd input exponent means an extra sqrt(2) in the output
    }
    u.i = intPart >> 1; // divide exponent by 2, lose LSB
    u.i += 127; // rebias exponent
    u.i <<= 23; // move biased exponent into exponent bits
    return accumulator * u.f;
}